

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

ArgInfoList * __thiscall
SoapySDR::Device::getFrequencyArgsInfo
          (ArgInfoList *__return_storage_ptr__,Device *this,int dir,size_t chan)

{
  double *pdVar1;
  undefined8 uVar2;
  long lVar3;
  ulong uVar4;
  RangeList ranges;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comps;
  ArgInfo info;
  undefined1 local_170 [32];
  ArgInfoList *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  Device *local_130;
  size_t local_128;
  undefined1 local_120 [192];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  (__return_storage_ptr__->super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = __return_storage_ptr__;
  local_130 = this;
  local_128 = chan;
  (*this->_vptr_Device[0x38])(&local_148);
  if (0x20 < (ulong)((long)local_148.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_148.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    ArgInfo::ArgInfo((ArgInfo *)local_120);
    std::__cxx11::string::_M_replace((ulong)local_120,0,(char *)local_120._8_8_,0x13005a);
    std::__cxx11::string::_M_replace((ulong)(local_120 + 0x40),0,(char *)local_120._72_8_,0x130070);
    std::__cxx11::string::_M_replace((ulong)(local_120 + 0x20),0,(char *)local_120._40_8_,0x13007a);
    std::__cxx11::string::_M_replace((ulong)(local_120 + 0x80),0,(char *)local_120._136_8_,0x13007e)
    ;
    local_120._160_4_ = FLOAT;
    std::__cxx11::string::_M_replace((ulong)(local_120 + 0x60),0,(char *)local_120._104_8_,0x130081)
    ;
    if ((ulong)((long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
LAB_0011d3ac:
      uVar2 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,1);
      if ((double *)local_170._0_8_ != (double *)0x0) {
        operator_delete((void *)local_170._0_8_);
      }
      ArgInfo::~ArgInfo((ArgInfo *)local_120);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_148);
      std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(local_150);
      _Unwind_Resume(uVar2);
    }
    (*local_130->_vptr_Device[0x3a])
              (local_170,local_130,(ulong)(uint)dir,local_128,
               local_148.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    if (local_170._0_8_ != local_170._8_8_) {
      local_120._184_8_ = *(double *)(local_170._0_8_ + 0x10);
      local_120._168_8_ = *(undefined8 *)local_170._0_8_;
      local_120._176_8_ = *(double *)(local_170._0_8_ + 8);
    }
    std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::push_back
              (local_150,(value_type *)local_120);
    if ((double *)local_170._0_8_ != (double *)0x0) {
      operator_delete((void *)local_170._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_60);
    if ((undefined1 *)local_120._128_8_ != local_120 + 0x90) {
      operator_delete((void *)local_120._128_8_);
    }
    if ((undefined1 *)local_120._96_8_ != local_120 + 0x70) {
      operator_delete((void *)local_120._96_8_);
    }
    if ((undefined1 *)local_120._64_8_ != local_120 + 0x50) {
      operator_delete((void *)local_120._64_8_);
    }
    if ((undefined1 *)local_120._32_8_ != local_120 + 0x30) {
      operator_delete((void *)local_120._32_8_);
    }
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_);
    }
    if (0x20 < (ulong)((long)local_148.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      pdVar1 = (double *)(local_170 + 0x10);
      uVar4 = 1;
      lVar3 = 0x20;
      do {
        ArgInfo::ArgInfo((ArgInfo *)local_120);
        std::__cxx11::string::_M_assign((string *)local_120);
        std::__cxx11::string::_M_replace
                  ((ulong)(local_120 + 0x20),0,(char *)local_120._40_8_,0x130068);
        std::__cxx11::string::_M_replace
                  ((ulong)(local_120 + 0x80),0,(char *)local_120._136_8_,0x13007e);
        local_120._160_4_ = FLOAT;
        std::__cxx11::string::_M_replace
                  ((ulong)(local_120 + 0x60),0,(char *)local_120._104_8_,0x1300c5);
        local_170._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"DEFAULT","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        if ((double *)local_170._0_8_ != pdVar1) {
          operator_delete((void *)local_170._0_8_);
        }
        local_170._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Default","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        if ((double *)local_170._0_8_ != pdVar1) {
          operator_delete((void *)local_170._0_8_);
        }
        local_170._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"IGNORE","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        if ((double *)local_170._0_8_ != pdVar1) {
          operator_delete((void *)local_170._0_8_);
        }
        local_170._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"Ignore","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
        if ((double *)local_170._0_8_ != pdVar1) {
          operator_delete((void *)local_170._0_8_);
        }
        if ((ulong)((long)local_148.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_148.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar4) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar4);
          goto LAB_0011d3ac;
        }
        (*local_130->_vptr_Device[0x3a])
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170,
                   local_130,(ulong)(uint)dir,local_128,
                   (long)&((local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
        if (local_170._0_8_ != local_170._8_8_) {
          local_120._184_8_ = *(double *)(local_170._0_8_ + 0x10);
          local_120._168_8_ = *(undefined8 *)local_170._0_8_;
          local_120._176_8_ = *(double *)(local_170._0_8_ + 8);
        }
        std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::push_back
                  (local_150,(ArgInfo *)local_120);
        if ((double *)local_170._0_8_ != (double *)0x0) {
          operator_delete((void *)local_170._0_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60);
        if ((undefined1 *)local_120._128_8_ != local_120 + 0x90) {
          operator_delete((void *)local_120._128_8_);
        }
        if ((undefined1 *)local_120._96_8_ != local_120 + 0x70) {
          operator_delete((void *)local_120._96_8_);
        }
        if ((undefined1 *)local_120._64_8_ != local_120 + 0x50) {
          operator_delete((void *)local_120._64_8_);
        }
        if ((undefined1 *)local_120._32_8_ != local_120 + 0x30) {
          operator_delete((void *)local_120._32_8_);
        }
        if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
          operator_delete((void *)local_120._0_8_);
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < (ulong)((long)local_148.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_148.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return local_150;
}

Assistant:

int SoapySDR::Device::activateStream(Stream *, const int flags, const long long, const size_t)
{
    return (flags == 0)? 0 : SOAPY_SDR_NOT_SUPPORTED;
}